

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::TimeZoneFormat::formatOffsetLocalizedGMT
          (TimeZoneFormat *this,int32_t offset,UBool isShort,UnicodeString *result,
          UErrorCode *status)

{
  short sVar1;
  UVector *this_00;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  void *pvVar6;
  uint8_t minDigits;
  int32_t srcLength;
  long lVar7;
  int index;
  uint uVar8;
  
  if (U_ZERO_ERROR < *status) {
    UnicodeString::setToBogus(result);
    return result;
  }
  if (offset + 0xfad9a400U < 0xf5b34801) {
    UnicodeString::setToBogus(result);
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return result;
  }
  if (offset == 0) {
    UnicodeString::copyFrom(result,&this->fGMTZeroFormat,'\0');
    return result;
  }
  uVar4 = (ulong)(uint)-offset;
  if (0 < offset) {
    uVar4 = (ulong)(uint)offset;
  }
  uVar3 = (int)uVar4 + (int)(uVar4 / 3600000) * -3600000;
  uVar2 = (uint)((ulong)uVar3 * 0x45e7b3 >> 0x20);
  uVar8 = uVar3 + (uVar2 >> 6) * -60000;
  if (offset < 0) {
    lVar7 = 0x508;
    if (999 < uVar8) goto LAB_001f7566;
    lVar7 = 0x518;
    lVar5 = 0x500;
    if (59999 < uVar3) {
      lVar7 = 0x500;
    }
  }
  else {
    lVar7 = 0x4f8;
    if (999 < uVar8) goto LAB_001f7566;
    lVar5 = 0x4f0;
    lVar7 = (ulong)(uVar3 < 60000) * 0x20 + 0x4f0;
  }
  if (isShort == '\0') {
    lVar7 = lVar5;
  }
LAB_001f7566:
  this_00 = *(UVector **)((this->super_Format).actualLocale + lVar7 + -8);
  index = 0;
  UnicodeString::copyFrom(result,&this->fGMTPatternPrefix,'\0');
  if (0 < this_00->count) {
    do {
      pvVar6 = UVector::elementAt(this_00,index);
      switch(*(undefined4 *)((long)pvVar6 + 0x10)) {
      case 0:
        UnicodeString::doAppend(result,*(UChar **)((long)pvVar6 + 8),0,-1);
        break;
      case 1:
        uVar3 = (uint)(uVar4 / 3600000);
        minDigits = (isShort == '\0') + '\x01';
        goto LAB_001f761b;
      case 2:
        uVar3 = uVar2 >> 6;
        goto LAB_001f7616;
      case 4:
        uVar3 = (uVar8 & 0xffff) / 1000;
LAB_001f7616:
        minDigits = '\x02';
LAB_001f761b:
        appendOffsetDigits(this,result,uVar3,minDigits);
      }
      index = index + 1;
    } while (index < this_00->count);
  }
  sVar1 = (this->fGMTPatternSuffix).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    srcLength = (this->fGMTPatternSuffix).fUnion.fFields.fLength;
  }
  else {
    srcLength = (int)sVar1 >> 5;
  }
  UnicodeString::doAppend(result,&this->fGMTPatternSuffix,0,srcLength);
  return result;
}

Assistant:

UnicodeString&
TimeZoneFormat::formatOffsetLocalizedGMT(int32_t offset, UBool isShort, UnicodeString& result, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        result.setToBogus();
        return result;
    }
    if (offset <= -MAX_OFFSET || offset >= MAX_OFFSET) {
        result.setToBogus();
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }

    if (offset == 0) {
        result.setTo(fGMTZeroFormat);
        return result;
    }

    UBool positive = TRUE;
    if (offset < 0) {
        offset = -offset;
        positive = FALSE;
    }

    int32_t offsetH = offset / MILLIS_PER_HOUR;
    offset = offset % MILLIS_PER_HOUR;
    int32_t offsetM = offset / MILLIS_PER_MINUTE;
    offset = offset % MILLIS_PER_MINUTE;
    int32_t offsetS = offset / MILLIS_PER_SECOND;

    U_ASSERT(offsetH <= MAX_OFFSET_HOUR && offsetM <= MAX_OFFSET_MINUTE && offsetS <= MAX_OFFSET_SECOND);

    const UVector* offsetPatternItems = NULL;
    if (positive) {
        if (offsetS != 0) {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_POSITIVE_HMS];
        } else if (offsetM != 0 || !isShort) {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_POSITIVE_HM];
        } else {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_POSITIVE_H];
        }
    } else {
        if (offsetS != 0) {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_NEGATIVE_HMS];
        } else if (offsetM != 0 || !isShort) {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_NEGATIVE_HM];
        } else {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_NEGATIVE_H];
        }
    }

    U_ASSERT(offsetPatternItems != NULL);

    // Building the GMT format string
    result.setTo(fGMTPatternPrefix);

    for (int32_t i = 0; i < offsetPatternItems->size(); i++) {
        const GMTOffsetField* item = (GMTOffsetField*)offsetPatternItems->elementAt(i);
        GMTOffsetField::FieldType type = item->getType();

        switch (type) {
        case GMTOffsetField::TEXT:
            result.append(item->getPatternText(), -1);
            break;

        case GMTOffsetField::HOUR:
            appendOffsetDigits(result, offsetH, (isShort ? 1 : 2));
            break;

        case GMTOffsetField::MINUTE:
            appendOffsetDigits(result, offsetM, 2);
            break;

        case GMTOffsetField::SECOND:
            appendOffsetDigits(result, offsetS, 2);
            break;
        }
    }

    result.append(fGMTPatternSuffix);
    return result;
}